

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

channel_s * fio_channel_find_dup_internal(channel_s *ch_tmp,uint64_t hashed,fio_collection_s *c)

{
  fio_lock_i fVar1;
  fio_ch_set__map_s_ *pfVar2;
  channel_s *pcVar3;
  fio_lock_i ret;
  timespec local_38;
  
  LOCK();
  fVar1 = c->lock;
  c->lock = '\x01';
  UNLOCK();
  local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar1);
  while (fVar1 != '\0') {
    local_38.tv_sec = 0;
    local_38.tv_nsec = 1;
    nanosleep(&local_38,(timespec *)0x0);
    LOCK();
    fVar1 = c->lock;
    c->lock = '\x01';
    UNLOCK();
    local_38.tv_sec = CONCAT71(local_38.tv_sec._1_7_,fVar1);
  }
  pfVar2 = fio_ch_set__find_map_pos_(&c->channels,hashed,ch_tmp);
  if ((pfVar2 == (fio_ch_set__map_s_ *)0x0) || (pfVar2->pos == (fio_ch_set__ordered_s_ *)0x0)) {
    pcVar3 = (channel_s *)0x0;
  }
  else {
    pcVar3 = pfVar2->pos->obj;
  }
  if (pcVar3 == (channel_s *)0x0) {
    LOCK();
    c->lock = '\0';
    UNLOCK();
    pcVar3 = (channel_s *)0x0;
  }
  else {
    LOCK();
    pcVar3->ref = pcVar3->ref + 1;
    UNLOCK();
    LOCK();
    c->lock = '\0';
    UNLOCK();
  }
  return pcVar3;
}

Assistant:

static channel_s *fio_channel_find_dup_internal(channel_s *ch_tmp,
                                                uint64_t hashed,
                                                fio_collection_s *c) {
  fio_lock(&c->lock);
  channel_s *ch = fio_ch_set_find(&c->channels, hashed, ch_tmp);
  if (!ch) {
    fio_unlock(&c->lock);
    return NULL;
  }
  fio_channel_dup(ch);
  fio_unlock(&c->lock);
  return ch;
}